

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

uint * __thiscall
JsUtil::
BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::LookupWithKey<int>
          (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int *key,uint *defaultValue)

{
  int iVar1;
  int i;
  uint *defaultValue_local;
  int *key_local;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<int>(this,key);
  this_local = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)defaultValue;
  if (-1 < iVar1) {
    this_local = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)anon_unknown_5::
                    ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                    ::Value((ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                             *)(this->entries + iVar1));
  }
  return (uint *)this_local;
}

Assistant:

inline const TValue& LookupWithKey(const TLookup& key, const TValue& defaultValue) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                return entries[i].Value();
            }
            return defaultValue;
        }